

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseBreakStmt(Parser *this)

{
  undefined8 *puVar1;
  CompileContext *pCVar2;
  long in_RSI;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined4 local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined4 local_30;
  undefined2 local_2c;
  
  local_58 = *(undefined4 *)(in_RSI + 0xb0);
  local_50[0] = &local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)(in_RSI + 0xb8),
             *(long *)(in_RSI + 0xc0) + *(long *)(in_RSI + 0xb8));
  local_2c = *(undefined2 *)(in_RSI + 0xdc);
  local_30 = *(undefined4 *)(in_RSI + 0xd8);
  if (*(int *)(in_RSI + 0xe0) == 0x10) {
    puVar1 = (undefined8 *)operator_new(0x38);
    local_88._0_4_ = 0x10;
    local_80._M_p = (pointer)&local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,*(long *)(in_RSI + 0xe8),
               *(long *)(in_RSI + 0xf0) + *(long *)(in_RSI + 0xe8));
    *puVar1 = &PTR__UnitExpr_00126f10;
    *(undefined4 *)(puVar1 + 1) = local_88._0_4_;
    puVar1[2] = puVar1 + 4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p == &local_70) {
      puVar1[4] = local_70._M_allocated_capacity;
      puVar1[5] = local_70._8_8_;
    }
    else {
      puVar1[2] = local_80._M_p;
      puVar1[4] = local_70._M_allocated_capacity;
    }
    puVar1[3] = local_78;
    *(undefined4 *)(puVar1 + 6) = *(undefined4 *)(in_RSI + 0x108);
    *(undefined2 *)((long)puVar1 + 0x34) = *(undefined2 *)(in_RSI + 0x10c);
  }
  else {
    parseExpr((Parser *)local_88);
    puVar1 = (undefined8 *)CONCAT44(local_88._4_4_,local_88._0_4_);
  }
  pCVar2 = (CompileContext *)operator_new(0x40);
  if (local_50[0] == &local_40) {
    local_70._8_8_ = local_40._8_8_;
    local_50[0] = &local_70;
  }
  (pCVar2->m_source)._M_dataplus._M_p = (pointer)&PTR__BreakStmt_001271b8;
  *(undefined4 *)&(pCVar2->m_source)._M_string_length = local_58;
  (pCVar2->m_source).field_2._M_allocated_capacity = (size_type)&pCVar2->m_options;
  if (local_50[0] == &local_70) {
    (pCVar2->m_options).m_filename._M_dataplus._M_p = (pointer)local_40._M_allocated_capacity;
    (pCVar2->m_options).m_filename._M_string_length = local_70._8_8_;
  }
  else {
    (pCVar2->m_source).field_2._M_allocated_capacity = (size_type)local_50[0];
    (pCVar2->m_options).m_filename._M_dataplus._M_p = (pointer)local_40._M_allocated_capacity;
  }
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&(pCVar2->m_source).field_2 + 8) = local_50[1];
  *(undefined4 *)&(pCVar2->m_options).m_filename.field_2 = local_30;
  *(undefined2 *)((long)&(pCVar2->m_options).m_filename.field_2 + 4) = local_2c;
  *(undefined8 **)((long)&(pCVar2->m_options).m_filename.field_2 + 8) = puVar1;
  this->m_context = pCVar2;
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseBreakStmt() {
        Token keyword = m_previous;
        std::unique_ptr<Expr> value;
        if (check(TokenType::SEMICOLON)) {
            value = std::make_unique<UnitExpr>(m_current);
        } else {
            value = parseExpr();
        }

        return std::make_unique<BreakStmt>(std::move(keyword), std::move(value));
    }